

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_sort.cc
# Opt level: O0

void __thiscall VersionsList::Read(VersionsList *this,istream *stream)

{
  bool bVar1;
  istream *piVar2;
  string local_38 [8];
  string line;
  istream *stream_local;
  VersionsList *this_local;
  
  std::__cxx11::string::string(local_38);
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>(stream,local_38);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    if (!bVar1) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->versions_,(value_type *)local_38);
  }
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void Read(std::istream& stream) {
		std::string line;
		while (std::getline(stream, line)) {
			versions_.push_back(line);
		}
	}